

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O3

void FT_Raccess_Guess(FT_Library library,FT_Stream stream,char *base_name,char **new_names,
                     FT_Long *offsets,FT_Error *errors)

{
  FT_Error FVar1;
  unsigned_long uVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    *new_names = (char *)0x0;
    if (stream == (FT_Stream)0x0) {
LAB_00217c95:
      *errors = 0;
      FVar1 = (**(code **)((long)&ft_raccess_guess_table[0].func + lVar3))
                        (library,stream,base_name,new_names,offsets);
      *errors = FVar1;
    }
    else {
      if (stream->read == (FT_Stream_IoFunc)0x0) {
LAB_00217c8d:
        stream->pos = 0;
        goto LAB_00217c95;
      }
      uVar2 = (*stream->read)(stream,0,(uchar *)0x0,0);
      if (uVar2 == 0) goto LAB_00217c8d;
      *errors = 0x55;
    }
    errors = errors + 1;
    offsets = offsets + 1;
    lVar3 = lVar3 + 0x10;
    new_names = new_names + 1;
    if (lVar3 == 0x90) {
      return;
    }
  } while( true );
}

Assistant:

FT_BASE_DEF( void )
  FT_Raccess_Guess( FT_Library  library,
                    FT_Stream   stream,
                    char*       base_name,
                    char      **new_names,
                    FT_Long    *offsets,
                    FT_Error   *errors )
  {
    FT_Int  i;


    for ( i = 0; i < FT_RACCESS_N_RULES; i++ )
    {
      new_names[i] = NULL;
      if ( NULL != stream )
        errors[i] = FT_Stream_Seek( stream, 0 );
      else
        errors[i] = FT_Err_Ok;

      if ( errors[i] )
        continue;

      errors[i] = ft_raccess_guess_table[i].func( library,
                                                  stream, base_name,
                                                  &(new_names[i]),
                                                  &(offsets[i]) );
    }

    return;
  }